

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this,
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *other)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  size_t sVar4;
  
  (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size = 0;
  pTVar3 = (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)pTVar3 ==
      &other->stack_storage) {
    reserve(this,(other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size
           );
    sVar2 = (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size;
    if (sVar2 != 0) {
      pTVar3 = (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr;
      pTVar1 = (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr;
      sVar4 = 0;
      do {
        pTVar3[sVar4].id = pTVar1[sVar4].id;
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
    }
    (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size = sVar2;
    (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size = 0;
  }
  else {
    pTVar1 = (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr;
    if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)pTVar1 !=
        &this->stack_storage) {
      free(pTVar1);
      pTVar3 = (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr;
    }
    (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr = pTVar3;
    sVar2 = other->buffer_capacity;
    (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size =
         (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size;
    this->buffer_capacity = sVar2;
    (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr =
         (TypedID<(spirv_cross::Types)0> *)0x0;
    (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}